

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

void __thiscall sptk::reaper::EpochTracker::CleanUp(EpochTracker *this)

{
  pointer pTVar1;
  pointer pfVar2;
  pointer pRVar3;
  pointer ppEVar4;
  ulong uVar5;
  pointer __pos;
  ulong uVar6;
  
  __pos = (this->resid_peaks_).
          super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->resid_peaks_).
           super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != __pos) {
    uVar6 = 0;
    do {
      ppEVar4 = __pos[uVar6].future.
                super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (__pos[uVar6].future.
          super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppEVar4) {
        uVar5 = 0;
        do {
          operator_delete(ppEVar4[uVar5]);
          uVar5 = uVar5 + 1;
          __pos = (this->resid_peaks_).
                  super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          ppEVar4 = __pos[uVar6].future.
                    super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar5 < (ulong)((long)__pos[uVar6].future.
                                       super__Vector_base<sptk::reaper::EpochTracker::EpochCand_*,_std::allocator<sptk::reaper::EpochTracker::EpochCand_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar4 >>
                                3));
        pRVar3 = (this->resid_peaks_).
                 super__Vector_base<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(((long)pRVar3 - (long)__pos >> 4) * 0x6db6db6db6db6db7));
  }
  std::
  vector<sptk::reaper::EpochTracker::ResidPeak,_std::allocator<sptk::reaper::EpochTracker::ResidPeak>_>
  ::_M_erase_at_end(&this->resid_peaks_,__pos);
  pTVar1 = (this->output_).
           super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->output_).
      super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar1) {
    (this->output_).
    super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar1;
  }
  pfVar2 = (this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (this->best_corr_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  return;
}

Assistant:

void EpochTracker::CleanUp(void) {
  for (size_t i = 0; i < resid_peaks_.size(); ++i) {
    for (size_t j = 0; j < resid_peaks_[i].future.size(); ++j) {
      delete resid_peaks_[i].future[j];
    }
  }
  resid_peaks_.clear();
  output_.clear();
  best_corr_.clear();
}